

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

ostream * notch::io::operator<<(ostream *out,valarray<double> *xs)

{
  double *pdVar1;
  double *local_20;
  double *it;
  valarray<double> *xs_local;
  ostream *out_local;
  
  local_20 = core::std::begin<double>(xs);
  while( true ) {
    pdVar1 = core::std::end<double>(xs);
    if (local_20 == pdVar1) break;
    pdVar1 = core::std::begin<double>(xs);
    if (local_20 != pdVar1) {
      std::operator<<(out," ");
    }
    std::ostream::operator<<(out,*local_20);
    local_20 = local_20 + 1;
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::valarray<double> &xs) {
    for (auto it = std::begin(xs); it != std::end(xs); ++it) {
        if (it != std::begin(xs)) {
            out << " ";
        }
        out << *it;
    }
    return out;
}